

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acutest.h
# Opt level: O2

int main(int argc,char **argv)

{
  acutest_test_ *test;
  byte bVar1;
  char cVar2;
  bool bVar3;
  acutest_test_data_ *paVar4;
  FILE *pFVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  acutest_state_ aVar9;
  __pid_t __pid;
  uint uVar10;
  int iVar11;
  size_t __n;
  ssize_t sVar12;
  char *pcVar13;
  uint *puVar14;
  ulong uVar15;
  acutest_timer_type_ *paVar16;
  acutest_timer_type_ *__s1;
  timespec *ptVar17;
  int i;
  long lVar18;
  ulong uStack_280;
  int exit_code;
  acutest_timer_type_ start;
  acutest_timer_type_ end;
  undefined8 local_59;
  __syscall_slong_t _Stack_51;
  
  acutest_argv0_ = *argv;
  acutest_colorize_ = isatty(1);
  acutest_list_size_ = 4;
  acutest_test_data_ = (acutest_test_data_ *)calloc(4,0x10);
  if (acutest_test_data_ == (acutest_test_data_ *)0x0) {
    fwrite("Out of memory.\n",0xf,1,_stderr);
    acutest_exit_(2);
  }
  bVar3 = false;
  for (iVar7 = 1; iVar7 < argc; iVar7 = iVar7 + 1) {
    paVar16 = (acutest_timer_type_ *)argv[iVar7];
    if (bVar3) {
LAB_00102edd:
      iVar6 = acutest_cmdline_callback_(0,(char *)paVar16);
LAB_00102ee9:
      if (iVar6 != 0) break;
    }
    else {
      if ((char)paVar16->tv_sec != '-') {
        bVar3 = false;
        goto LAB_00102edd;
      }
      bVar1 = *(byte *)((long)&paVar16->tv_sec + 1);
      if (bVar1 == 0) goto LAB_00102edd;
      if ((bVar1 != 0x2d) || (*(char *)((long)&paVar16->tv_sec + 2) != '\0')) {
        __s1 = (acutest_timer_type_ *)((long)&paVar16->tv_sec + 2);
        for (puVar14 = &acutest_cmdline_options_[0].flags; iVar6 = puVar14[-1], iVar6 != 0;
            puVar14 = puVar14 + 6) {
          pcVar13 = *(char **)(puVar14 + -3);
          if (pcVar13 == (char *)0x0 || bVar1 != 0x2d) {
            if (bVar1 == ((ACUTEST_CMDLINE_OPTION_ *)(puVar14 + -5))->shortname) {
              if ((*puVar14 & 2) == 0) {
                iVar6 = acutest_cmdline_callback_(iVar6,(char *)0x0);
                if (iVar6 != 0) goto LAB_001030e0;
                pcVar13 = argv[iVar7];
                bVar3 = false;
                if (pcVar13[2] == '\0') goto LAB_00102ef1;
                lVar18 = 0;
                goto LAB_00102fa7;
              }
              if ((char)__s1->tv_sec == '\0') {
                iVar11 = iVar7 + 1;
                if (iVar11 < argc) {
                  iVar6 = acutest_cmdline_callback_(iVar6,argv[iVar11]);
                  bVar3 = false;
                  iVar7 = iVar11;
                  goto LAB_00102ee9;
                }
                iVar6 = -0x7ffffffe;
                __s1 = paVar16;
              }
              iVar6 = acutest_cmdline_callback_(iVar6,(char *)__s1);
              bVar3 = false;
              goto LAB_00102ee9;
            }
          }
          else {
            __n = strlen(pcVar13);
            iVar11 = strncmp((char *)__s1,pcVar13,__n);
            if (iVar11 == 0) {
              cVar2 = *(char *)((long)&__s1->tv_sec + __n);
              if (cVar2 == '=') {
                if ((*puVar14 & 3) == 0) {
                  paVar16 = &end;
                  snprintf((char *)paVar16,0x21,"--%s",pcVar13);
                  iVar6 = -0x7ffffffd;
                  goto LAB_001030b8;
                }
                paVar16 = (acutest_timer_type_ *)((long)&__s1->tv_sec + __n + 1);
LAB_00103089:
                iVar6 = acutest_cmdline_callback_(iVar6,(char *)paVar16);
              }
              else {
                if (cVar2 != '\0') goto LAB_00102ed5;
                if ((*puVar14 & 2) != 0) {
                  iVar6 = -0x7ffffffe;
                  goto LAB_00103089;
                }
                paVar16 = (acutest_timer_type_ *)0x0;
LAB_001030b8:
                iVar6 = acutest_cmdline_callback_(iVar6,(char *)paVar16);
              }
              bVar3 = false;
              goto LAB_00102ee9;
            }
          }
LAB_00102ed5:
        }
        if ((bVar1 == 0x2d) && (pcVar13 = strchr((char *)paVar16,0x3d), pcVar13 != (char *)0x0)) {
          uVar15 = (long)pcVar13 - (long)paVar16;
          if (0x1f < (ulong)((long)pcVar13 - (long)paVar16)) {
            uVar15 = 0x20;
          }
          strncpy((char *)&end,(char *)paVar16,uVar15);
          *(undefined1 *)((long)&end.tv_sec + uVar15) = 0;
          paVar16 = &end;
        }
        iVar6 = acutest_cmdline_callback_(-0x7fffffff,(char *)paVar16);
        bVar3 = false;
        goto LAB_00102ee9;
      }
      bVar3 = true;
    }
LAB_00102ef1:
  }
LAB_001030e0:
  if (acutest_timer_ - 1U < 2) {
    acutest_timer_id_ = acutest_timer_;
  }
  iVar7 = acutest_count_(ACUTEST_STATE_SELECTED);
  bVar1 = acutest_exclude_mode_;
  paVar4 = acutest_test_data_;
  if (iVar7 < 1) {
    for (lVar18 = 0; lVar18 != 0x40; lVar18 = lVar18 + 0x10) {
      *(undefined4 *)((long)&paVar4->state + lVar18) = 0xfffffffe;
    }
  }
  else {
    for (lVar18 = 0; lVar18 != 0x40; lVar18 = lVar18 + 0x10) {
      *(uint *)((long)&paVar4->state + lVar18) =
           ~(uint)(*(int *)((long)&paVar4->state + lVar18) == -3 ^ bVar1) | 0xfffffffe;
    }
  }
  iVar7 = acutest_no_exec_;
  if (acutest_no_exec_ < 0) {
    iVar6 = acutest_count_(ACUTEST_STATE_NEEDTORUN);
    iVar7 = 1;
    if (1 < iVar6) {
      end.tv_sec = CONCAT71(end.tv_sec._1_7_,10);
      iVar6 = open("/proc/self/status",0);
      iVar7 = 0;
      if (iVar6 != -1) {
        uStack_280 = 1;
LAB_001031aa:
        uVar15 = uStack_280;
        if (uVar15 < 0x1ff) goto code_r0x001031b6;
        goto LAB_001031d6;
      }
    }
  }
LAB_0010324d:
  acutest_no_exec_ = iVar7;
  if (acutest_tap_ == '\x01') {
    if (2 < acutest_verbose_level_) {
      acutest_verbose_level_ = 2;
    }
    acutest_no_summary_ = 1;
    if (acutest_worker_ == '\0') {
      uVar8 = acutest_count_(ACUTEST_STATE_NEEDTORUN);
      printf("1..%d\n",(ulong)uVar8);
    }
  }
  iVar7 = acutest_worker_index_;
  for (lVar18 = 0; iVar11 = acutest_list_size_, iVar6 = acutest_verbose_level_, lVar18 != 0x40;
      lVar18 = lVar18 + 0x10) {
    if (*(int *)((long)&acutest_test_data_->state + lVar18) == -2) {
      test = (acutest_test_ *)((long)&acutest_list_[0].name + lVar18);
      acutest_test_already_logged_ = 0;
      acutest_current_test_ = test;
      acutest_timer_get_time_(&start);
      if (acutest_no_exec_ == 0) {
        fflush(_stdout);
        fflush(_stderr);
        __pid = fork();
        if (__pid == -1) {
          puVar14 = (uint *)__errno_location();
          pcVar13 = strerror(*puVar14);
          acutest_error_("Cannot fork. %s [%d]",pcVar13,(ulong)*puVar14);
        }
        else {
          if (__pid == 0) {
            acutest_worker_ = 1;
            aVar9 = acutest_do_run_(test,iVar7);
            acutest_exit_(aVar9);
          }
          waitpid(__pid,&exit_code,0);
          uVar8 = exit_code & 0x7f;
          if (uVar8 == 0) {
            aVar9 = (uint)exit_code >> 8 & 0xff;
            goto LAB_001033df;
          }
          if ((int)(uVar8 * 0x1000000 + 0x1000000) < 0x2000000) {
            acutest_error_("Test ended in an unexpected way [%d].",(ulong)(uint)exit_code);
          }
          else {
            if ((uVar8 < 0x10) && ((0x452fU >> ((uint)((ulong)uVar8 - 1) & 0x1f) & 1) != 0)) {
              ptVar17 = (timespec *)
                        (&DAT_001050d4 + *(int *)(&DAT_001050d4 + ((ulong)uVar8 - 1) * 4));
            }
            else {
              snprintf((char *)&end,0x20,"signal %d");
              ptVar17 = &end;
            }
            acutest_error_("Test interrupted by %s.",ptVar17);
          }
        }
        aVar9 = ACUTEST_STATE_FAILED;
      }
      else {
        aVar9 = acutest_do_run_(test,iVar7);
      }
LAB_001033df:
      iVar7 = iVar7 + 1;
      acutest_timer_get_time_(&end);
      paVar4 = acutest_test_data_;
      acutest_current_test_ = (acutest_test_ *)0x0;
      *(acutest_state_ *)((long)&acutest_test_data_->state + lVar18) = aVar9;
      *(double *)((long)&paVar4->duration + lVar18) =
           (double)(end.tv_nsec - start.tv_nsec) / 1000000000.0 +
           (double)(end.tv_sec -
                   CONCAT53(start.tv_sec._3_5_,
                            CONCAT12(start.tv_sec._2_1_,
                                     CONCAT11(start.tv_sec._1_1_,(undefined1)start.tv_sec))));
    }
  }
  if (0 < acutest_verbose_level_ && (acutest_no_summary_ & 1) == 0) {
    iVar7 = acutest_count_(ACUTEST_STATE_EXCLUDED);
    uVar8 = acutest_count_(ACUTEST_STATE_SUCCESS);
    uVar10 = acutest_count_(ACUTEST_STATE_FAILED);
    if (2 < (uint)iVar6) {
      acutest_colored_printf_(10,"Summary:\n");
      printf("  Count of run unit tests:        %4d\n",(ulong)(uint)(iVar11 - iVar7));
      printf("  Count of successful unit tests: %4d\n",(ulong)uVar8);
      printf("  Count of failed unit tests:     %4d\n",(ulong)uVar10);
    }
    if (uVar10 == 0) {
      acutest_colored_printf_(0xc,"SUCCESS:");
      puts(" No unit tests have failed.");
    }
    else {
      acutest_colored_printf_(0xb,"FAILED:");
      pcVar13 = "have";
      if (uVar10 == 1) {
        pcVar13 = "has";
      }
      printf(" %d of %d unit tests %s failed.\n",(ulong)uVar10,(ulong)(uint)(iVar11 - iVar7),pcVar13
            );
    }
    if (2 < acutest_verbose_level_) {
      putchar(10);
    }
  }
  pFVar5 = acutest_xml_output_;
  if (acutest_xml_output_ != (FILE *)0x0) {
    pcVar13 = acutest_basename_(*argv);
    fwrite("<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n",0x27,1,(FILE *)pFVar5);
    pFVar5 = acutest_xml_output_;
    iVar7 = acutest_list_size_;
    uVar8 = acutest_count_(ACUTEST_STATE_FAILED);
    iVar6 = acutest_count_(ACUTEST_STATE_SKIPPED);
    iVar11 = acutest_count_(ACUTEST_STATE_EXCLUDED);
    fprintf((FILE *)pFVar5,
            "<testsuite name=\"%s\" tests=\"%d\" errors=\"0\" failures=\"%d\" skip=\"%d\">\n",
            pcVar13,(ulong)(uint)iVar7,(ulong)uVar8,(ulong)(uint)(iVar6 + iVar11));
    for (lVar18 = 0; paVar4 = acutest_test_data_, lVar18 != 0x40; lVar18 = lVar18 + 0x10) {
      fprintf((FILE *)acutest_xml_output_,"  <testcase name=\"%s\" time=\"%.2f\">\n",
              *(undefined8 *)((long)&acutest_test_data_->duration + lVar18),
              *(undefined8 *)((long)&acutest_list_[0].name + lVar18));
      iVar7 = *(int *)((long)&paVar4->state + lVar18);
      pcVar13 = "<skipped />";
      if (iVar7 == -1) {
LAB_00103614:
        fprintf((FILE *)acutest_xml_output_,"    %s\n",pcVar13);
      }
      else if (iVar7 != 0) {
        pcVar13 = "<skipped />";
        if (iVar7 != 2) {
          pcVar13 = "<failure />";
        }
        goto LAB_00103614;
      }
      fwrite("  </testcase>\n",0xe,1,(FILE *)acutest_xml_output_);
    }
    fwrite("</testsuite>\n",0xd,1,(FILE *)acutest_xml_output_);
    fclose((FILE *)acutest_xml_output_);
  }
  if ((acutest_worker_ == '\x01') &&
     (iVar7 = acutest_count_(ACUTEST_STATE_EXCLUDED), iVar7 + 1 == acutest_list_size_)) {
    lVar18 = 0;
    do {
      if (lVar18 + 0x10 == 0x50) {
        uVar8 = 1;
        break;
      }
      uVar8 = *(uint *)((long)&acutest_test_data_->state + lVar18);
      lVar18 = lVar18 + 0x10;
    } while (uVar8 == 0xffffffff);
  }
  else {
    iVar7 = acutest_count_(ACUTEST_STATE_FAILED);
    uVar8 = (uint)(0 < iVar7);
  }
  acutest_cleanup_();
  return uVar8;
LAB_00102fa7:
  bVar1 = pcVar13[lVar18 + 2];
  if (bVar1 == 0) goto LAB_00102ef1;
  for (puVar14 = &acutest_cmdline_options_[0].flags; puVar14[-1] != 0; puVar14 = puVar14 + 6) {
    if (bVar1 == ((ACUTEST_CMDLINE_OPTION_ *)(puVar14 + -5))->shortname) {
      iVar6 = -0x7ffffffe;
      if ((*puVar14 & 2) != 0) goto LAB_00102fe2;
      paVar16 = (acutest_timer_type_ *)0x0;
      iVar6 = puVar14[-1];
      goto LAB_00102ff7;
    }
  }
  iVar6 = -0x7fffffff;
LAB_00102fe2:
  start.tv_sec._0_1_ = 0x2d;
  start.tv_sec._2_1_ = 0;
  paVar16 = &start;
  start.tv_sec._1_1_ = bVar1;
LAB_00102ff7:
  iVar6 = acutest_cmdline_callback_(iVar6,(char *)paVar16);
  lVar18 = lVar18 + 1;
  if (iVar6 != 0) goto LAB_001030e0;
  goto LAB_00102fa7;
code_r0x001031b6:
  sVar12 = read(iVar6,(void *)((long)&end.tv_sec + uVar15),0x1ff - uVar15);
  uStack_280 = sVar12 + uVar15;
  if (0 < sVar12) goto LAB_001031aa;
LAB_001031d6:
  *(undefined1 *)((long)&end.tv_sec + uVar15) = 0;
  pcVar13 = strstr((char *)&end,"\nTracerPid:");
  iVar7 = 0;
  if (pcVar13 < (char *)((long)&local_59 + 1U) && pcVar13 != (char *)0x0) {
    iVar11 = atoi(pcVar13 + 0xb);
    close(iVar6);
    if (iVar11 != 0) {
      iVar7 = 1;
    }
    goto LAB_0010324d;
  }
  if (uVar15 == 0x1ff) {
    end.tv_sec = local_59;
    end.tv_nsec = _Stack_51;
    uStack_280 = 0x20;
    goto LAB_001031aa;
  }
  close(iVar6);
  goto LAB_0010324d;
}

Assistant:

int
main(int argc, char** argv)
{
    int i, index;
    int exit_code = 1;

    acutest_argv0_ = argv[0];

#if defined ACUTEST_UNIX_
    acutest_colorize_ = isatty(STDOUT_FILENO);
#elif defined ACUTEST_WIN_
 #if defined _BORLANDC_
    acutest_colorize_ = isatty(_fileno(stdout));
 #else
    acutest_colorize_ = _isatty(_fileno(stdout));
 #endif
#else
    acutest_colorize_ = 0;
#endif

    /* Count all test units */
    acutest_list_size_ = 0;
    for(i = 0; acutest_list_[i].func != NULL; i++)
        acutest_list_size_++;

    acutest_test_data_ = (struct acutest_test_data_*)calloc(acutest_list_size_, sizeof(struct acutest_test_data_));
    if(acutest_test_data_ == NULL) {
        fprintf(stderr, "Out of memory.\n");
        acutest_exit_(2);
    }

    /* Parse options */
    acutest_cmdline_read_(acutest_cmdline_options_, argc, argv, acutest_cmdline_callback_);

    /* Initialize the proper timer. */
    acutest_timer_init_();

#if defined(ACUTEST_WIN_)
    SetUnhandledExceptionFilter(acutest_seh_exception_filter_);
#ifdef _MSC_VER
    _set_abort_behavior(0, _WRITE_ABORT_MSG);
#endif
#endif

    /* Determine what to run. */
    if(acutest_count_(ACUTEST_STATE_SELECTED) > 0) {
        enum acutest_state_ if_selected;
        enum acutest_state_ if_unselected;

        if(!acutest_exclude_mode_) {
            if_selected = ACUTEST_STATE_NEEDTORUN;
            if_unselected = ACUTEST_STATE_EXCLUDED;
        } else {
            if_selected = ACUTEST_STATE_EXCLUDED;
            if_unselected = ACUTEST_STATE_NEEDTORUN;
        }

        for(i = 0; acutest_list_[i].func != NULL; i++) {
            if(acutest_test_data_[i].state == ACUTEST_STATE_SELECTED)
                acutest_test_data_[i].state = if_selected;
            else
                acutest_test_data_[i].state = if_unselected;
        }
    } else {
        /* By default, we want to run all tests. */
        for(i = 0; acutest_list_[i].func != NULL; i++)
            acutest_test_data_[i].state = ACUTEST_STATE_NEEDTORUN;
    }

    /* By default, we want to suppress running tests as child processes if we
     * run just one test, or if we're under debugger: Debugging tests is then
     * so much easier. */
    if(acutest_no_exec_ < 0) {
        if(acutest_count_(ACUTEST_STATE_NEEDTORUN) <= 1  ||  acutest_under_debugger_())
            acutest_no_exec_ = 1;
        else
            acutest_no_exec_ = 0;
    }

    if(acutest_tap_) {
        /* TAP requires we know test result ("ok", "not ok") before we output
         * anything about the test, and this gets problematic for larger verbose
         * levels. */
        if(acutest_verbose_level_ > 2)
            acutest_verbose_level_ = 2;

        /* TAP harness should provide some summary. */
        acutest_no_summary_ = 1;

        if(!acutest_worker_)
            printf("1..%d\n", acutest_count_(ACUTEST_STATE_NEEDTORUN));
    }

    index = acutest_worker_index_;
    for(i = 0; acutest_list_[i].func != NULL; i++) {
        if(acutest_test_data_[i].state == ACUTEST_STATE_NEEDTORUN)
            acutest_run_(&acutest_list_[i], index++, i);
    }

    /* Write a summary */
    if(!acutest_no_summary_ && acutest_verbose_level_ >= 1) {
        int n_run, n_success, n_failed ;

        n_run = acutest_list_size_ - acutest_count_(ACUTEST_STATE_EXCLUDED);
        n_success = acutest_count_(ACUTEST_STATE_SUCCESS);
        n_failed = acutest_count_(ACUTEST_STATE_FAILED);

        if(acutest_verbose_level_ >= 3) {
            acutest_colored_printf_(ACUTEST_COLOR_DEFAULT_INTENSIVE_, "Summary:\n");

            printf("  Count of run unit tests:        %4d\n", n_run);
            printf("  Count of successful unit tests: %4d\n", n_success);
            printf("  Count of failed unit tests:     %4d\n", n_failed);
        }

        if(n_failed == 0) {
            acutest_colored_printf_(ACUTEST_COLOR_GREEN_INTENSIVE_, "SUCCESS:");
            printf(" No unit tests have failed.\n");
        } else {
            acutest_colored_printf_(ACUTEST_COLOR_RED_INTENSIVE_, "FAILED:");
            printf(" %d of %d unit tests %s failed.\n",
                    n_failed, n_run, (n_failed == 1) ? "has" : "have");
        }

        if(acutest_verbose_level_ >= 3)
            printf("\n");
    }

    if (acutest_xml_output_) {
        const char* suite_name = acutest_basename_(argv[0]);
        fprintf(acutest_xml_output_, "<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n");
        fprintf(acutest_xml_output_, "<testsuite name=\"%s\" tests=\"%d\" errors=\"0\" failures=\"%d\" skip=\"%d\">\n",
            suite_name,
            (int)acutest_list_size_,
            acutest_count_(ACUTEST_STATE_FAILED),
            acutest_count_(ACUTEST_STATE_SKIPPED) + acutest_count_(ACUTEST_STATE_EXCLUDED));
        for(i = 0; acutest_list_[i].func != NULL; i++) {
            struct acutest_test_data_ *details = &acutest_test_data_[i];
            const char* str_state;
            fprintf(acutest_xml_output_, "  <testcase name=\"%s\" time=\"%.2f\">\n", acutest_list_[i].name, details->duration);

            switch(details->state) {
                case ACUTEST_STATE_SUCCESS:     str_state = NULL; break;
                case ACUTEST_STATE_EXCLUDED:    /* Fall through. */
                case ACUTEST_STATE_SKIPPED:     str_state = "<skipped />"; break;
                case ACUTEST_STATE_FAILED:      /* Fall through. */
                default:                        str_state = "<failure />"; break;
            }

            if(str_state != NULL)
                fprintf(acutest_xml_output_, "    %s\n", str_state);
            fprintf(acutest_xml_output_, "  </testcase>\n");
        }
        fprintf(acutest_xml_output_, "</testsuite>\n");
        fclose(acutest_xml_output_);
    }

    if(acutest_worker_  &&  acutest_count_(ACUTEST_STATE_EXCLUDED)+1 == acutest_list_size_) {
        /* If we are the child process, we need to propagate the test state
         * without any moderation. */
        for(i = 0; acutest_list_[i].func != NULL; i++) {
            if(acutest_test_data_[i].state != ACUTEST_STATE_EXCLUDED) {
                exit_code = (int) acutest_test_data_[i].state;
                break;
            }
        }
    } else {
        if(acutest_count_(ACUTEST_STATE_FAILED) > 0)
            exit_code = 1;
        else
            exit_code = 0;
    }

    acutest_cleanup_();
    return exit_code;
}